

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::BranchLayerParams::SerializeWithCachedSizes
          (BranchLayerParams *this,CodedOutputStream *output)

{
  bool bVar1;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  BranchLayerParams *this_local;
  
  bVar1 = has_ifbranch(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (1,&this->ifbranch_->super_MessageLite,output);
  }
  bVar1 = has_elsebranch(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (2,&this->elsebranch_->super_MessageLite,output);
  }
  return;
}

Assistant:

void BranchLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.BranchLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.NeuralNetwork ifBranch = 1;
  if (this->has_ifbranch()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, *this->ifbranch_, output);
  }

  // .CoreML.Specification.NeuralNetwork elseBranch = 2;
  if (this->has_elsebranch()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2, *this->elsebranch_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.BranchLayerParams)
}